

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

bool anon_unknown.dwarf_d06ba1::preferAlternative
               (TransitionOptions resolve,int gotDst,int altDst,bool altIsLater,bool inGap)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000081;
  
  uVar2 = 0x40;
  if ((int)CONCAT71(in_register_00000081,inGap) != 0) {
    uVar2 = 4;
  }
  if ((gotDst ^ altDst) == 1 &&
      ((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
             super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) != 0) {
    uVar1 = 0x20;
    if (inGap) {
      uVar1 = 2;
    }
    if ((inGap != altIsLater) == (altDst == 1)) {
      uVar2 = uVar1;
    }
  }
  return ((uVar2 & ~(uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                          super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) != 0) !=
         altIsLater;
}

Assistant:

Q_DECL_COLD_FUNCTION
bool preferAlternative(QDateTimePrivate::TransitionOptions resolve,
                       // is_dst flags of incumbent and an alternative:
                       int gotDst, int altDst,
                       // True precisely if alternative selects a later UTC time:
                       bool altIsLater,
                       // True for a gap, false for a fold:
                       bool inGap)
{
    // If resolve has this option set, prefer the later candidate, else the earlier:
    QDateTimePrivate::TransitionOption preferLater = inGap ? QDateTimePrivate::GapUseAfter
                                                           : QDateTimePrivate::FoldUseAfter;
    if (resolve.testFlag(QDateTimePrivate::FlipForReverseDst)) {
        // gotDst and altDst are {-1: unknown, 0: standard, 1: daylight-saving}
        // So gotDst ^ altDst is 1 precisely if exactly one candidate thinks it's DST.
        if ((altDst ^ gotDst) == 1) {
            // In this case, we can tell whether we have reversed DST: that's a
            // gap with DST before it or a fold with DST after it.
#if 1
            const bool isReversed = (altDst == 1) != (altIsLater == inGap);
#else // Pedagogic version of the same thing:
            bool isReversed;
            if (altIsLater == inGap) // alt is after a gap or before a fold, so summer-time
                isReversed = altDst != 1; // flip if summer-time isn't DST
            else // alt is before a gap or after a fold, so winter-time
                isReversed = altDst == 1; // flip if winter-time is DST
#endif
            if (isReversed) {
                preferLater = inGap ? QDateTimePrivate::GapUseBefore
                                    : QDateTimePrivate::FoldUseBefore;
            }
        } // Otherwise, we can't tell, so assume not.
    }
    return resolve.testFlag(preferLater) == altIsLater;
}